

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O0

void __thiscall
directed_flag_complex_in_memory_t<std::pair<int,_float>_>::~directed_flag_complex_in_memory_t
          (directed_flag_complex_in_memory_t<std::pair<int,_float>_> *this)

{
  bool bVar1;
  reference pdVar2;
  __normal_iterator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_*,_std::vector<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
  *in_RDI;
  directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> *unaff_retaddr;
  directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> p;
  iterator __end0;
  iterator __begin0;
  vector<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
  *__range2;
  vector<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
  *in_stack_ffffffffffffffb8;
  vector<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
  *in_stack_ffffffffffffffd0;
  __normal_iterator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_*,_std::vector<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
  local_18 [3];
  
  local_18[0]._M_current =
       (directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> *)
       std::
       vector<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  std::
  vector<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
  ::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_*,_std::vector<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
                               *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    pdVar2 = __gnu_cxx::
             __normal_iterator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_*,_std::vector<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
             ::operator*(local_18);
    in_stack_ffffffffffffffd0 =
         *(vector<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
           **)&(pdVar2->data).second;
    directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>::free_memory(unaff_retaddr);
    __gnu_cxx::
    __normal_iterator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_*,_std::vector<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
    ::operator++(local_18);
  }
  std::
  vector<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
  ::~vector(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

~directed_flag_complex_in_memory_t() {
		for (auto p : vertex_cells) p.free_memory();
	}